

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<unsigned_long_long>::relocate
          (QArrayDataPointer<unsigned_long_long> *this,qsizetype offset,unsigned_long_long **data)

{
  bool bVar1;
  unsigned_long_long *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long_long *res;
  
  first = (unsigned_long_long *)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<unsigned_long_long,long_long>
            (first,in_RDI,(unsigned_long_long *)0x37def7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<unsigned_long_long>,unsigned_long_long_const*>
                        (data,(QArrayDataPointer<unsigned_long_long> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(unsigned_long_long **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }